

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDirWrapper.cpp
# Opt level: O3

QString * __thiscall
DataDirWrapper::getFieldName(QString *__return_storage_ptr__,DataDirWrapper *this,size_t fieldId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(fieldId) {
  case 0:
    goto LAB_0012e709;
  case 1:
    goto LAB_0012e709;
  case 2:
    goto LAB_0012e672;
  case 3:
    psVar1 = (storage_type *)0x13;
    break;
  case 4:
LAB_0012e672:
    psVar1 = (storage_type *)0x12;
    break;
  case 5:
    psVar1 = (storage_type *)0x15;
    break;
  case 6:
    psVar1 = (storage_type *)0xf;
    break;
  case 7:
    psVar1 = (storage_type *)0x1a;
    break;
  case 8:
LAB_0012e709:
    psVar1 = (storage_type *)0x10;
    break;
  case 9:
    psVar1 = (storage_type *)0xd;
    break;
  case 10:
    psVar1 = (storage_type *)0x1c;
    break;
  case 0xb:
    psVar1 = (storage_type *)0x16;
    break;
  case 0xc:
    psVar1 = (storage_type *)0x14;
    break;
  case 0xd:
    psVar1 = (storage_type *)0x1d;
    break;
  case 0xe:
    psVar1 = (storage_type *)0xb;
    break;
  default:
    psVar1 = (storage_type *)0x0;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString DataDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case pe::DIR_EXPORT: return "Export Directory";
        case pe::DIR_IMPORT: return "Import Directory";
        case pe::DIR_RESOURCE : return "Resource Directory";
        case pe::DIR_EXCEPTION: return "Exception Directory";
        case pe::DIR_SECURITY: return "Security Directory";
        case pe::DIR_BASERELOC: return "Base Relocation Table";
        case pe::DIR_DEBUG : return "Debug Directory";
        case pe::DIR_ARCHITECTURE: return "Architecture Specific Data";
        case pe::DIR_GLOBALPTR : return "RVA of GlobalPtr";
        case pe::DIR_TLS: return "TLS Directory";
        case pe::DIR_LOAD_CONFIG: return "Load Configuration Directory";
        case pe::DIR_BOUND_IMPORT: return "Bound Import Directory";
        case pe::DIR_IAT: return "Import Address Table";
        case pe::DIR_DELAY_IMPORT: return "Delay Load Import Descriptors";
        case pe::DIR_COM_DESCRIPTOR : return ".NET header";
    }
    return "";
}